

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  vector<int,_std::allocator<int>_> *this_00;
  pointer *ppDVar2;
  pointer *ppVVar3;
  ostringstream *this_01;
  pointer *ppiVar4;
  ContextInfo *pCVar5;
  TestLog *pTVar6;
  iterator __position;
  iterator __position_00;
  iterator iVar7;
  pointer pPVar8;
  byte bVar9;
  pointer pVVar10;
  bool bVar11;
  int iVar12;
  deUint32 dVar13;
  CaseType CVar14;
  uint uVar15;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  long *plVar16;
  size_t sVar17;
  Texture2D *this_02;
  TextureCube *this_03;
  Texture2DArray *this_04;
  Texture3D *this_05;
  pointer ppTVar18;
  _Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *p_Var19;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  MultiTexShader *this_06;
  long *plVar20;
  pointer pVVar21;
  undefined1 *puVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  pointer pDVar26;
  TextureUnitCase *pTVar27;
  int levelNdx;
  ulong uVar28;
  uint width;
  uint uVar29;
  float fVar30;
  GLenum type;
  TextureUnitCase *local_480;
  vector<glu::DataType,_std::allocator<glu::DataType>_> samplerTypes;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texScales;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texBiases;
  vector<int,_std::allocator<int>_> num2dArrayLayers;
  TextureFormat texFormat;
  long local_3e0;
  pointer local_3d8 [2];
  vector<int,_std::allocator<int>_> *local_3c8;
  ulong local_3c0;
  CaseType local_3b4;
  RGBA local_3b0;
  RGBA local_3ac;
  TextureFormat fmt;
  float fStack_3a0;
  float fStack_39c;
  long local_398 [2];
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>>
  *local_388;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_380;
  ulong local_378;
  vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>> *local_370;
  vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>> *local_368;
  vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *local_360;
  vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *local_358;
  ulong local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  TextureFormatInfo fmtInfo;
  ios_base local_2b0 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  ios_base local_138 [264];
  
  iVar12 = this->m_numUnitsParam;
  if (iVar12 < 1) {
    pCVar5 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar12 = (*pCVar5->_vptr_ContextInfo[2])(pCVar5,0x8872);
  }
  this->m_numUnits = iVar12;
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_480 = this;
  deRandom_init(&rnd.m_rnd,this->m_randSeed);
  pTVar27 = local_480;
  fVar30 = deRandom_getFloat(&rnd.m_rnd);
  iVar12 = pTVar27->m_numUnits;
  if (0.7 <= fVar30) {
    dVar13 = deRandom_getUint32(&rnd.m_rnd);
    iVar25 = 1;
    if (1 < iVar12 + -2) {
      iVar25 = iVar12 + -2;
    }
    iVar12 = dVar13 % ((iVar12 - iVar25) + 1U) + iVar25;
  }
  local_480->m_numTextures = iVar12;
  this_01 = (ostringstream *)(fmtInfo.valueMin.m_data + 2);
  fmtInfo.valueMin.m_data._0_8_ = pTVar6;
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&unitTypes);
  std::ostream::operator<<(&unitTypes,local_480->m_numUnits);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&unitTypes);
  std::ios_base::~ios_base(local_138);
  plVar16 = (long *)std::__cxx11::string::replace((ulong)&fmt,0,(char *)0x0,0xaf3b04);
  ppiVar4 = &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar20 = plVar16 + 2;
  if ((long *)*plVar16 == plVar20) {
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar20;
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppiVar4;
  }
  else {
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar20;
    num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar16;
  }
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar16[1];
  *plVar16 = (long)plVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&num2dArrayLayers);
  ppDVar2 = &samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pDVar26 = (pointer)(plVar16 + 2);
  if ((pointer)*plVar16 == pDVar26) {
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pDVar26;
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppDVar2;
  }
  else {
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pDVar26;
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar16;
  }
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar16[1];
  *plVar16 = (long)pDVar26;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&unitTypes);
  std::ostream::operator<<(&unitTypes,local_480->m_numTextures);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&unitTypes);
  std::ios_base::~ios_base(local_138);
  pDVar26 = (pointer)0xf;
  if ((pointer *)
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != ppDVar2) {
    pDVar26 = samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage;
  }
  if (pDVar26 < (pointer)(local_3e0 +
                         (long)samplerTypes.
                               super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                               _M_impl.super__Vector_impl_data._M_finish)) {
    pDVar26 = (pointer)0xf;
    if (texFormat != (TextureFormat)local_3d8) {
      pDVar26 = local_3d8[0];
    }
    if ((pointer)(local_3e0 +
                 (long)samplerTypes.
                       super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                       super__Vector_impl_data._M_finish) <= pDVar26) {
      plVar16 = (long *)std::__cxx11::string::replace
                                  ((ulong)&texFormat,0,(char *)0x0,
                                   (ulong)samplerTypes.
                                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00571c3b;
    }
  }
  plVar16 = (long *)std::__cxx11::string::_M_append((char *)&samplerTypes,(ulong)texFormat);
LAB_00571c3b:
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&texBiases.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar21 = (pointer)(plVar16 + 2);
  if ((pointer)*plVar16 == pVVar21) {
    texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar21->m_data;
  }
  else {
    texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar21->m_data;
    texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar16;
  }
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar16[1];
  *plVar16 = (long)pVVar21;
  plVar16[1] = 0;
  *(undefined1 *)pVVar21->m_data = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&texBiases);
  ppVVar3 = &texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar21 = (pointer)(plVar16 + 2);
  if ((pointer)*plVar16 == pVVar21) {
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar21->m_data;
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar3;
  }
  else {
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar21->m_data;
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar16;
  }
  pVVar10 = texScales.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar16[1];
  *plVar16 = (long)pVVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if (texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    std::ios::clear((int)this_01 +
                    (int)*(undefined8 *)
                          (CONCAT44(fmtInfo.valueMin.m_data[3],fmtInfo.valueMin.m_data[2]) + -0x18))
    ;
  }
  else {
    sVar17 = strlen((char *)texScales.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,(char *)pVVar10,sVar17);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fmtInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar3) {
    operator_delete(texScales.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(texScales.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if (texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&texBiases.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(texBiases.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(texBiases.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if (texFormat != (TextureFormat)local_3d8) {
    operator_delete((void *)texFormat,(ulong)((long)local_3d8[0] + 1));
  }
  if ((pointer *)
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != ppDVar2) {
    operator_delete(samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)samplerTypes.
                                  super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if ((pointer *)
      num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != ppiVar4) {
    operator_delete(num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (fmt != (TextureFormat)local_398) {
    operator_delete((void *)fmt,local_398[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_01);
  std::ios_base::~ios_base(local_2b0);
  pTVar27 = local_480;
  local_380 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&local_480->m_textureTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_380,
             (long)local_480->m_numTextures);
  local_388 = (vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>>
               *)&pTVar27->m_textureParams;
  std::
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve((vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
             *)local_388,(long)pTVar27->m_numTextures);
  local_3c8 = &pTVar27->m_ndxTexType;
  std::vector<int,_std::allocator<int>_>::reserve(local_3c8,(long)pTVar27->m_numTextures);
  if (0 < pTVar27->m_numTextures) {
    local_368 = (vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>> *)&pTVar27->m_textures3d;
    local_370 = (vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>> *)
                &pTVar27->m_textures2dArray;
    local_360 = (vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *)
                &pTVar27->m_texturesCube;
    local_358 = (vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *)&pTVar27->m_textures2d;
    local_378 = 0;
    do {
      CVar14 = pTVar27->m_caseType;
      if (CVar14 == CASE_MIXED) {
        CVar14 = deRandom_getUint32(&rnd.m_rnd);
        CVar14 = CVar14 & CASE_ONLY_3D;
      }
      type = 0x806f;
      if (CVar14 == CASE_ONLY_2D_ARRAY) {
        type = 0x8c1a;
      }
      if (CVar14 == CASE_ONLY_CUBE) {
        type = 0x8513;
      }
      uVar29 = (uint)(CVar14 == CASE_ONLY_2D_ARRAY) * 0x20 + 0x20;
      if (CVar14 == CASE_ONLY_CUBE) {
        uVar29 = 0x100;
      }
      width = uVar29;
      if (CVar14 == CASE_ONLY_2D) {
        type = 0xde1;
        width = 0x80;
      }
      iVar12 = 1;
      if (CVar14 == CASE_ONLY_3D) {
        iVar12 = 0x20;
      }
      dVar13 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             *(deUint32 *)(s_testSizedInternalFormats + (ulong)(dVar13 % 0x31) * 4))
      ;
      bVar11 = glu::isGLInternalColorFormatFilterable
                         (*(deUint32 *)(s_testSizedInternalFormats + (ulong)(dVar13 % 0x31) * 4));
      dVar13 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(*(undefined4 *)(s_testWrapModes + (ulong)(dVar13 % 3) * 4),
                             (deUint32)
                             texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      dVar13 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             *(undefined4 *)(s_testWrapModes + (ulong)(dVar13 % 3) * 4));
      dVar13 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(*(undefined4 *)(s_testWrapModes + (ulong)(dVar13 % 3) * 4),
                             texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_4_);
      if (bVar11) {
        dVar13 = deRandom_getUint32(&rnd.m_rnd);
        texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(*(undefined4 *)((long)&s_testMagFilters + (ulong)(dVar13 & 1) * 4),
                               texScales.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
        dVar13 = deRandom_getUint32(&rnd.m_rnd);
        uVar15 = dVar13 % 6;
        puVar22 = s_testMinFilters;
      }
      else {
        texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(0x2600,texScales.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
        dVar13 = deRandom_getUint32(&rnd.m_rnd);
        uVar15 = dVar13 & 1;
        puVar22 = (undefined1 *)&s_testNearestMinFilters;
      }
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             *(undefined4 *)((long)puVar22 + (ulong)uVar15 * 4));
      __position._M_current =
           (local_480->m_textureTypes).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_480->m_textureTypes).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_380,__position,&type);
      }
      else {
        *__position._M_current = type;
        (local_480->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (local_480->m_textureParams).
           super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (local_480->m_textureParams).
          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>>
        ::_M_realloc_insert<deqp::gles3::Functional::TextureUnitCase::TextureParameters_const&>
                  (local_388,__position_00,(TextureParameters *)&texScales);
      }
      else {
        *(pointer *)&(__position_00._M_current)->minFilter =
             texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(pointer *)__position_00._M_current =
             texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)&(__position_00._M_current)->wrapModeT =
             texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppTVar1 = &(local_480->m_textureParams).
                   super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      texFormat = glu::mapGLInternalFormat
                            ((deUint32)
                             texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      if (CVar14 == CASE_ONLY_2D) {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(local_480->m_textures2d).
                                   super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_480->m_textures2d).
                                  super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar7._M_current =
             (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_3c8,iVar7,(int *)&fmtInfo);
        }
        else {
          *iVar7._M_current = (int)fmtInfo.valueMin.m_data[0];
          (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        this_02 = (Texture2D *)operator_new(0x50);
        tcu::Texture2D::Texture2D(this_02,&texFormat,width,0x80);
        fmtInfo.valueMin.m_data._0_8_ = this_02;
        std::vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>>::emplace_back<tcu::Texture2D*>
                  (local_358,(Texture2D **)&fmtInfo);
      }
      else if (CVar14 == CASE_ONLY_CUBE) {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(local_480->m_texturesCube).
                                   super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_480->m_texturesCube).
                                  super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar7._M_current =
             (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_3c8,iVar7,(int *)&fmtInfo);
        }
        else {
          *iVar7._M_current = (int)fmtInfo.valueMin.m_data[0];
          (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        this_03 = (TextureCube *)operator_new(0x168);
        tcu::TextureCube::TextureCube(this_03,&texFormat,width);
        fmtInfo.valueMin.m_data._0_8_ = this_03;
        std::vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>>::
        emplace_back<tcu::TextureCube*>(local_360,(TextureCube **)&fmtInfo);
      }
      else if (CVar14 == CASE_ONLY_2D_ARRAY) {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(local_480->m_textures2dArray).
                                   super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_480->m_textures2dArray).
                                  super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar7._M_current =
             (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_3c8,iVar7,(int *)&fmtInfo);
        }
        else {
          *iVar7._M_current = (int)fmtInfo.valueMin.m_data[0];
          (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        this_04 = (Texture2DArray *)operator_new(0x58);
        tcu::Texture2DArray::Texture2DArray(this_04,&texFormat,width,uVar29,4);
        fmtInfo.valueMin.m_data._0_8_ = this_04;
        std::vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>>::
        emplace_back<tcu::Texture2DArray*>(local_370,(Texture2DArray **)&fmtInfo);
      }
      else {
        fmtInfo.valueMin.m_data[0] =
             (float)((ulong)((long)(local_480->m_textures3d).
                                   super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_480->m_textures3d).
                                  super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar7._M_current =
             (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_3c8,iVar7,(int *)&fmtInfo);
        }
        else {
          *iVar7._M_current = (int)fmtInfo.valueMin.m_data[0];
          (local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        this_05 = (Texture3D *)operator_new(0x58);
        tcu::Texture3D::Texture3D(this_05,&texFormat,width,uVar29,iVar12);
        fmtInfo.valueMin.m_data._0_8_ = this_05;
        std::vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>>::emplace_back<tcu::Texture3D*>
                  (local_368,(Texture3D **)&fmtInfo);
      }
      tcu::getTextureFormatInfo(&fmtInfo,&texFormat);
      uVar29 = 0x1f;
      if (width != 0) {
        for (; width >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      local_350 = (ulong)((uVar29 ^ 0xffffffe0) + 0x21);
      local_338 = fmtInfo.valueMin.m_data[0];
      fStack_334 = fmtInfo.valueMin.m_data[1];
      fStack_330 = fmtInfo.valueMin.m_data[2];
      fStack_32c = fmtInfo.valueMin.m_data[3];
      local_348 = fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0];
      fStack_344 = fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1];
      fStack_340 = fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2];
      fStack_33c = fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3];
      local_3c0 = 0;
      local_3b4 = CVar14;
      do {
        CVar14 = local_3b4;
        dVar13 = deRandom_getUint32(&rnd.m_rnd);
        lVar24 = 0;
        uVar28 = 0;
        do {
          pTVar27 = local_480;
          iVar12 = (int)uVar28;
          bVar9 = (byte)uVar28;
          if (CVar14 == CASE_ONLY_2D) {
            tcu::Texture2D::allocLevel
                      ((local_480->m_textures2d).
                       super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],iVar12);
            uVar29 = 8 >> (bVar9 & 0x1f);
            iVar12 = uVar29 + (uVar29 == 0);
            ppTVar18 = (pointer)(pTVar27->m_textures2d).
                                super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
LAB_005724d8:
            p_Var19 = &(ppTVar18[-1]->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
            ;
          }
          else {
            if (CVar14 != CASE_ONLY_CUBE) {
              if (CVar14 == CASE_ONLY_2D_ARRAY) {
                tcu::Texture2DArray::allocLevel
                          ((local_480->m_textures2dArray).
                           super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1],iVar12);
                uVar29 = 8 >> (bVar9 & 0x1f);
                iVar12 = uVar29 + (uVar29 == 0);
                ppTVar18 = (pointer)(pTVar27->m_textures2dArray).
                                    super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                tcu::Texture3D::allocLevel
                          ((local_480->m_textures3d).
                           super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish[-1],iVar12);
                uVar29 = 8 >> (bVar9 & 0x1f);
                iVar12 = uVar29 + (uVar29 == 0);
                ppTVar18 = (pTVar27->m_textures3d).
                           super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
              }
              goto LAB_005724d8;
            }
            tcu::TextureCube::allocLevel
                      ((local_480->m_texturesCube).
                       super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],(CubeFace)local_3c0,iVar12);
            uVar29 = 8 >> (bVar9 & 0x1f);
            iVar12 = uVar29 + (uVar29 == 0);
            p_Var19 = &(pTVar27->m_texturesCube).
                       super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]->m_access[local_3c0].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
            ;
          }
          pPVar8 = (p_Var19->_M_impl).super__Vector_impl_data._M_start;
          unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)&pPVar8[uVar28].super_ConstPixelBufferAccess.m_format;
          lVar23 = 2;
          do {
            *(undefined4 *)
             ((long)&unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar23 * 4) =
                 *(undefined4 *)
                  ((long)(pPVar8->super_ConstPixelBufferAccess).m_size.m_data +
                  lVar23 * 4 + lVar24 + -8);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 5);
          lVar23 = 5;
          do {
            *(undefined4 *)
             ((long)&unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar23 * 4) =
                 *(undefined4 *)
                  ((long)(pPVar8->super_ConstPixelBufferAccess).m_size.m_data +
                  lVar23 * 4 + lVar24 + -8);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 8);
          local_3ac.m_value = dVar13 | 0xff000000;
          tcu::RGBA::toVec(&local_3ac);
          texBiases.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start =
               (pointer)CONCAT44(samplerTypes.
                                 super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_ * fStack_344 +
                                 fStack_334,
                                 samplerTypes.
                                 super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_ * local_348 +
                                 local_338);
          texBiases.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(samplerTypes.
                                 super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_ * fStack_33c +
                                 fStack_32c,
                                 samplerTypes.
                                 super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._0_4_ * fStack_340 +
                                 fStack_330);
          local_3b0.m_value = ~dVar13 | 0xff000000;
          tcu::RGBA::toVec(&local_3b0);
          num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44((float)fmt.type * fStack_344 + fStack_334,
                                 (float)fmt.order * local_348 + local_338);
          num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(fStack_39c * fStack_33c + fStack_32c,
                                 fStack_3a0 * fStack_340 + fStack_330);
          tcu::fillWithGrid((PixelBufferAccess *)&unitTypes,iVar12,(Vec4 *)&texBiases,
                            (Vec4 *)&num2dArrayLayers);
          uVar28 = uVar28 + 1;
          lVar24 = lVar24 + 0x28;
          CVar14 = local_3b4;
        } while (uVar28 != local_350);
      } while ((local_3b4 == CASE_ONLY_CUBE) &&
              (uVar28 = local_3c0 + 1, bVar11 = local_3c0 < 5, local_3c0 = uVar28, bVar11));
      uVar29 = (int)local_378 + 1;
      local_378 = (ulong)uVar29;
      pTVar27 = local_480;
    } while ((int)uVar29 < local_480->m_numTextures);
  }
  this_00 = &pTVar27->m_unitTextures;
  std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)pTVar27->m_numUnits);
  fmtInfo.valueMin.m_data._0_8_ = fmtInfo.valueMin.m_data._0_8_ & 0xffffffff00000000;
  if (0 < pTVar27->m_numTextures) {
    fVar30 = 0.0;
    do {
      iVar7._M_current =
           (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this_00,iVar7,(int *)&fmtInfo);
      }
      else {
        *iVar7._M_current = (int)fVar30;
        (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      fVar30 = (float)((int)fmtInfo.valueMin.m_data[0] + 1);
      fmtInfo.valueMin.m_data[0] = fVar30;
    } while ((int)fVar30 < pTVar27->m_numTextures);
  }
  last._M_current =
       (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  first._M_current =
       (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) < pTVar27->m_numUnits) {
    do {
      uVar29 = pTVar27->m_numTextures;
      dVar13 = deRandom_getUint32(&rnd.m_rnd);
      fVar30 = (float)(dVar13 % uVar29);
      fmtInfo.valueMin.m_data[0] = fVar30;
      iVar7._M_current =
           (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,iVar7,(int *)&fmtInfo);
        last._M_current =
             (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar7._M_current = (int)fVar30;
        last._M_current = iVar7._M_current + 1;
        (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = last._M_current;
      }
      first._M_current =
           (pTVar27->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    } while ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) <
             pTVar27->m_numUnits);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,first,last);
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&unitTypes,(long)pTVar27->m_numUnits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            (&texScales,(long)pTVar27->m_numUnits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            (&texBiases,(long)pTVar27->m_numUnits);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::reserve
            (&samplerTypes,(long)pTVar27->m_numUnits);
  std::vector<int,_std::allocator<int>_>::reserve(&num2dArrayLayers,(long)pTVar27->m_numUnits);
  if (0 < pTVar27->m_numUnits) {
    lVar24 = 0;
    do {
      lVar23 = (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar24];
      texFormat.order = *(ChannelOrder *)(*(long *)local_380 + lVar23 * 4);
      fmt = glu::mapGLInternalFormat(*(deUint32 *)(*(long *)local_388 + lVar23 * 0x18));
      tcu::getTextureFormatInfo(&fmtInfo,&fmt);
      if (unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&unitTypes,
                   (iterator)
                   unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,&texFormat.order);
      }
      else {
        *unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = texFormat.order;
        unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (texFormat.order == 0x8c1a) {
        type = (local_480->m_textures2dArray).
               super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>.
               _M_impl.super__Vector_impl_data._M_start
               [(local_480->m_ndxTexType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar23]]->m_numLayers;
        if (num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&num2dArrayLayers,
                     (iterator)
                     num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&type);
        }
        else {
          *num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = type;
          num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&texScales,&fmtInfo.lookupScale);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&texBiases,&fmtInfo.lookupBias);
      if ((int)texFormat.order < 0x8513) {
        if (texFormat.order == 0xde1) {
          type = glu::getSampler2DType(fmt);
          if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
            _M_realloc_insert<glu::DataType>
                      (&samplerTypes,
                       (iterator)
                       samplerTypes.
                       super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                       super__Vector_impl_data._M_finish,&type);
          }
          else {
LAB_005729ea:
            *samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
             super__Vector_impl_data._M_finish = type;
            samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else if (texFormat.order == 0x806f) {
          type = glu::getSampler3DType(fmt);
          if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) goto LAB_005729ea;
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    (&samplerTypes,
                     (iterator)
                     samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&type);
        }
      }
      else if (texFormat.order == 0x8513) {
        type = glu::getSamplerCubeType(fmt);
        if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_005729ea;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  (&samplerTypes,
                   (iterator)
                   samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&type);
      }
      else if (texFormat.order == 0x8c1a) {
        type = glu::getSampler2DArrayType(fmt);
        if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_005729ea;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  (&samplerTypes,
                   (iterator)
                   samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&type);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < local_480->m_numUnits);
  }
  pTVar27 = local_480;
  this_06 = (MultiTexShader *)operator_new(0x1d0);
  dVar13 = deRandom_getUint32(&rnd.m_rnd);
  MultiTexShader::MultiTexShader
            (this_06,dVar13,pTVar27->m_numUnits,&unitTypes,&samplerTypes,&texScales,&texBiases,
             &num2dArrayLayers);
  pTVar27->m_shader = this_06;
  iVar12 = extraout_EAX;
  if (num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar12 = extraout_EAX_00;
  }
  if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)samplerTypes.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)samplerTypes.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar12 = extraout_EAX_01;
  }
  if (texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texBiases.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)texBiases.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)texBiases.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar12 = extraout_EAX_02;
  }
  if (texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texScales.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)texScales.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)texScales.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar12 = extraout_EAX_03;
  }
  if (unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar12 = extraout_EAX_04;
  }
  return iVar12;
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndxTexType.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types, and randomized parameters for every texture.

			TextureParameters	params;

			DE_STATIC_ASSERT(CASE_ONLY_2D == 0 && CASE_MIXED + 1 == CASE_LAST);

			int						texType			= m_caseType == CASE_MIXED ? rnd.getInt(0, (int)CASE_MIXED - 1) : (int)m_caseType;
			bool					is2dTex			= texType == 0;
			bool					isCubeTex		= texType == 1;
			bool					is2dArrayTex	= texType == 2;
			bool					is3dTex			= texType == 3;

			DE_ASSERT(is2dTex || isCubeTex || is2dArrayTex || is3dTex);

			GLenum					type			= is2dTex		? GL_TEXTURE_2D		: isCubeTex ? GL_TEXTURE_CUBE_MAP	: is2dArrayTex ? GL_TEXTURE_2D_ARRAY		: GL_TEXTURE_3D;
			const int				texWidth		= is2dTex		? TEXTURE_WIDTH_2D	: isCubeTex ? TEXTURE_WIDTH_CUBE	: is2dArrayTex ? TEXTURE_WIDTH_2D_ARRAY		: TEXTURE_WIDTH_3D;
			const int				texHeight		= is2dTex		? TEXTURE_HEIGHT_2D	: isCubeTex ? TEXTURE_HEIGHT_CUBE	: is2dArrayTex ? TEXTURE_HEIGHT_2D_ARRAY	: TEXTURE_HEIGHT_3D;

			const int				texDepth		= is3dTex ? TEXTURE_DEPTH_3D : 1;
			const int				texLayers		= is2dArrayTex ? TEXTURE_LAYERS_2D_ARRAY : 1;

			bool					mipmaps			= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight) && deIsPowerOfTwo32(texDepth));
			int						numLevels		= mipmaps ? deLog2Floor32(de::max(de::max(texWidth, texHeight), texDepth))+1 : 1;

			params.internalFormat = s_testSizedInternalFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testSizedInternalFormats) - 1)];

			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(params.internalFormat);

			params.wrapModeS = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeR = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];

			params.magFilter = isFilterable ? s_testMagFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)] : GL_NEAREST;

			if (mipmaps)
				params.minFilter = isFilterable ?
					s_testMinFilters			[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)] :
					s_testNearestMinFilters		[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNearestMinFilters) - 1)];
			else
				params.minFilter = isFilterable ?
					s_testNonMipmapMinFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)] :
					GL_NEAREST;

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			tcu::TextureFormat texFormat = glu::mapGLInternalFormat((deUint32)params.internalFormat);

			if (is2dTex)
			{
				m_ndxTexType.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d texture vector.
				m_textures2d.push_back(new tcu::Texture2D(texFormat, texWidth, texHeight));
			}
			else if (isCubeTex)
			{
				m_ndxTexType.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube texture vector.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(texFormat, texWidth));
			}
			else if (is2dArrayTex)
			{
				m_ndxTexType.push_back((int)m_textures2dArray.size()); // Remember the index this texture has in the 2d array texture vector.
				m_textures2dArray.push_back(new tcu::Texture2DArray(texFormat, texWidth, texHeight, texLayers));
			}
			else
			{
				m_ndxTexType.push_back((int)m_textures3d.size()); // Remember the index this texture has in the 3d vector.
				m_textures3d.push_back(new tcu::Texture3D(texFormat, texWidth, texHeight, texDepth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFormat);
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = isCubeTex ? (int)tcu::CUBEFACE_LAST : 1;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha	= 0xff000000;

				deUint32 colorA = alpha | rgb;
				deUint32 colorB = alpha | ((~rgb) & 0x00ffffff);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2dTex)
						m_textures2d.back()->allocLevel(levelNdx);
					else if (isCubeTex)
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);
					else if (is2dArrayTex)
						m_textures2dArray.back()->allocLevel(levelNdx);
					else
						m_textures3d.back()->allocLevel(levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2dTex			? m_textures2d.back()->getLevel(levelNdx)
												  : isCubeTex		? m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face)
												  : is2dArrayTex	? m_textures2dArray.back()->getLevel(levelNdx)
												  :					  m_textures3d.back()->getLevel(levelNdx);

					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Generate information for shader.

		vector<GLenum>			unitTypes;
		vector<Vec4>			texScales;
		vector<Vec4>			texBiases;
		vector<glu::DataType>	samplerTypes;
		vector<int>				num2dArrayLayers;

		unitTypes.reserve(m_numUnits);
		texScales.reserve(m_numUnits);
		texBiases.reserve(m_numUnits);
		samplerTypes.reserve(m_numUnits);
		num2dArrayLayers.reserve(m_numUnits);

		for (int i = 0; i < m_numUnits; i++)
		{
			int						texNdx		= m_unitTextures[i];
			GLenum					type		= m_textureTypes[texNdx];
			tcu::TextureFormat		fmt			= glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat);
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(fmt);

			unitTypes.push_back(type);

			if (type == GL_TEXTURE_2D_ARRAY)
				num2dArrayLayers.push_back(m_textures2dArray[m_ndxTexType[texNdx]]->getNumLayers());

			texScales.push_back(fmtInfo.lookupScale);
			texBiases.push_back(fmtInfo.lookupBias);

			switch (type)
			{
				case GL_TEXTURE_2D:			samplerTypes.push_back(glu::getSampler2DType(fmt));			break;
				case GL_TEXTURE_CUBE_MAP:	samplerTypes.push_back(glu::getSamplerCubeType(fmt));		break;
				case GL_TEXTURE_2D_ARRAY:	samplerTypes.push_back(glu::getSampler2DArrayType(fmt));	break;
				case GL_TEXTURE_3D:			samplerTypes.push_back(glu::getSampler3DType(fmt));			break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		// Create shader.

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes, samplerTypes, texScales, texBiases, num2dArrayLayers);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}